

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * cs_impl::file_system::get_current_dir_abi_cxx11_(void)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  runtime_error *prVar4;
  ostream *this;
  string *in_RDI;
  string local_11c0;
  stringstream str;
  ostream local_1190 [376];
  char temp [4096];
  
  memset(temp,0,0x1000);
  pcVar2 = getcwd(temp,0x1000);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)in_RDI,temp,(allocator *)&str);
    return in_RDI;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (iVar1 != 0xc) {
    if (iVar1 == 0xd) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&str,"Permission denied",(allocator *)&local_11c0);
      cs::runtime_error::runtime_error(prVar4,(string *)&str);
      __cxa_throw(prVar4,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    this = std::operator<<(local_1190,"Unrecognised errno: ");
    std::ostream::operator<<((ostream *)this,iVar1);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    cs::runtime_error::runtime_error(prVar4,&local_11c0);
    __cxa_throw(prVar4,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&str,"Out of memory",(allocator *)&local_11c0);
  cs::runtime_error::runtime_error(prVar4,(string *)&str);
  __cxa_throw(prVar4,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

std::string get_current_dir()
		{
			char temp[PATH_MAX] = "";

			if (::getcwd(temp, PATH_MAX) != nullptr) {
				return std::string(temp);
			}

			int error = errno;
			switch (error) {
			case EACCES:
				throw cs::runtime_error("Permission denied");

			case ENOMEM:
				throw cs::runtime_error("Out of memory");

			default: {
				std::stringstream str;
				str << "Unrecognised errno: " << error;
				throw cs::runtime_error(str.str());
			}
			}
		}